

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Functional::anon_unknown_1::TriangleInterpolationTest::iterate
          (TriangleInterpolationTest *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float *pfVar3;
  ostringstream *poVar4;
  undefined8 uVar5;
  GLenum GVar6;
  TestLog *log;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  int iVar10;
  RenderTarget *pRVar11;
  char *description;
  int vtxNdx;
  IterateResult IVar12;
  int vtxNdx_1;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int vtxNdx_2;
  ulong uVar17;
  float fVar18;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  _Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  local_258;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorBuffer;
  Surface resultImage;
  ScopedLogSection section;
  RasterizationArguments local_1f0;
  string iterationDescription;
  SceneTriangle tri;
  
  local_258._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_258._M_impl.super__Vector_impl_data._M_start._4_4_,
                         this->m_iteration + 1);
  de::toString<int>((string *)&drawBuffer,(int *)&local_258);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resultImage,
                 "Test iteration ",(string *)&drawBuffer);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tri,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resultImage,
                 " / ");
  de::toString<int>((string *)&colorBuffer,&this->m_iterationCount);
  std::operator+(&iterationDescription,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tri,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&colorBuffer);
  std::__cxx11::string::~string((string *)&colorBuffer);
  std::__cxx11::string::~string((string *)&tri);
  std::__cxx11::string::~string((string *)&resultImage);
  std::__cxx11::string::~string((string *)&drawBuffer);
  log = ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
        m_log;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(drawBuffer.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,this->m_iteration + 1);
  de::toString<int>((string *)&resultImage,(int *)&drawBuffer);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tri,
                 "Iteration",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resultImage);
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&tri,&iterationDescription);
  std::__cxx11::string::~string((string *)&tri);
  std::__cxx11::string::~string((string *)&resultImage);
  iVar10 = (this->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface(&resultImage,iVar10,iVar10);
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  colorBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  colorBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  colorBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tri.positions[0].m_data[0] = 1.0;
  tri.positions[0].m_data[1] = 0.0;
  tri.positions[0].m_data[2] = 0.0;
  tri.positions[0].m_data[3] = 1.0;
  tri.positions[1].m_data[0] = 0.0;
  tri.positions[1].m_data[1] = 1.0;
  tri.positions[1].m_data[2] = 0.0;
  tri.positions[1].m_data[3] = 1.0;
  tri.positions[2].m_data[0] = 0.0;
  tri.positions[2].m_data[1] = 0.0;
  tri.positions[2].m_data[2] = 1.0;
  tri.positions[2].m_data[3] = 1.0;
  deRandom_init((deRandom *)&local_1f0,this->m_iteration * 1000 + this->m_primitive + 0x7b);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize(&drawBuffer,6)
  ;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&colorBuffer,6);
  lVar15 = 0;
  uVar17 = 0;
  while( true ) {
    if ((long)(int)((ulong)((long)drawBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)drawBuffer.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) <= (long)uVar17)
    break;
    fVar18 = deRandom_getFloat((deRandom *)&local_1f0);
    *(float *)((long)(drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar15) =
         fVar18 * 1.8 + -0.9;
    fVar18 = deRandom_getFloat((deRandom *)&local_1f0);
    *(float *)((long)(drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar15 + 4) =
         fVar18 * 1.8 + -0.9;
    *(undefined4 *)
     ((long)(drawBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start)->m_data + lVar15 + 8) = 0;
    fVar18 = 1.0;
    if (this->m_projective == true) {
      fVar18 = deRandom_getFloat((deRandom *)&local_1f0);
      fVar18 = fVar18 * 3.8 + 0.2;
      uVar5 = *(undefined8 *)
               ((long)(drawBuffer.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar15);
      *(ulong *)((long)(drawBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar15) =
           CONCAT44(fVar18 * (float)((ulong)uVar5 >> 0x20),fVar18 * (float)uVar5);
      *(float *)((long)(drawBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar15 + 8) =
           *(float *)((long)(drawBuffer.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar15 + 8) *
           fVar18;
    }
    *(float *)((long)(drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar15 + 0xc) = fVar18;
    puVar1 = (undefined8 *)((long)&tri + lVar15 + (uVar17 / 3) * -0x30);
    uVar5 = puVar1[1];
    puVar2 = (undefined8 *)
             ((long)(colorBuffer.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar15);
    *puVar2 = *puVar1;
    puVar2[1] = uVar5;
    uVar17 = uVar17 + 1;
    lVar15 = lVar15 + 0x10;
  }
  GVar6 = this->m_primitive;
  if (GVar6 == 4) {
    for (iVar10 = 2; iVar13 = iVar10 + -2,
        iVar13 < (int)((ulong)((long)drawBuffer.
                                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)drawBuffer.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4) + -2;
        iVar10 = iVar10 + 3) {
      tcu::TriangleSceneSpec::SceneTriangle::SceneTriangle(&tri);
      tri.positions[0].m_data._0_8_ =
           *(undefined8 *)
            drawBuffer.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar13].m_data;
      tri.positions[0].m_data._8_8_ =
           *(undefined8 *)
            (drawBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar13].m_data + 2);
      tri.positions[1].m_data._0_8_ =
           *(undefined8 *)
            drawBuffer.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar10 + -1].m_data;
      tri.positions[1].m_data._8_8_ =
           *(undefined8 *)
            (drawBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar10 + -1].m_data + 2);
      tri.positions[2].m_data._0_8_ =
           *(undefined8 *)
            drawBuffer.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar10].m_data;
      tri.positions[2].m_data._8_8_ =
           *(undefined8 *)
            (drawBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar10].m_data + 2);
      tri.sharedEdge[0] = false;
      tri.sharedEdge[1] = false;
      tri.sharedEdge[2] = false;
      tri.colors[0].m_data._0_8_ =
           *(undefined8 *)
            colorBuffer.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar13].m_data;
      tri.colors[0].m_data._8_8_ =
           *(undefined8 *)
            (colorBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar13].m_data + 2);
      tri.colors[1].m_data._0_8_ =
           *(undefined8 *)
            colorBuffer.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar10 + -1].m_data;
      tri.colors[1].m_data._8_8_ =
           *(undefined8 *)
            (colorBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar10 + -1].m_data + 2);
      tri.colors[2].m_data._0_8_ =
           *(undefined8 *)
            colorBuffer.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar10].m_data;
      tri.colors[2].m_data._8_8_ =
           *(undefined8 *)
            (colorBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar10].m_data + 2);
      std::
      vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ::push_back((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   *)&local_258,&tri);
    }
  }
  else if (GVar6 == 5) {
    lVar16 = 0x200000000;
    lVar15 = 0x10;
    for (lVar14 = 0;
        lVar14 < ((long)drawBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)drawBuffer.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) * 0x10000000 + -0x200000000 >>
                 0x20; lVar14 = lVar14 + 1) {
      tcu::TriangleSceneSpec::SceneTriangle::SceneTriangle(&tri);
      pfVar3 = (float *)((long)drawBuffer.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_data + lVar15);
      tri.positions[0].m_data._0_8_ = *(undefined8 *)pfVar3;
      tri.positions[0].m_data._8_8_ = *(undefined8 *)(pfVar3 + 2);
      pfVar3 = (float *)((long)(drawBuffer.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar15);
      tri.positions[1].m_data._0_8_ = *(undefined8 *)pfVar3;
      tri.positions[1].m_data._8_8_ = *(undefined8 *)(pfVar3 + 2);
      pfVar3 = (float *)((long)(drawBuffer.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data +
                        (lVar16 >> 0x1c));
      tri.positions[2].m_data._0_8_ = *(undefined8 *)pfVar3;
      tri.positions[2].m_data._8_8_ = *(undefined8 *)(pfVar3 + 2);
      tri.sharedEdge[0] = false;
      tri.sharedEdge[1] = false;
      tri.sharedEdge[2] = false;
      pfVar3 = (float *)((long)colorBuffer.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_data + lVar15);
      tri.colors[0].m_data._0_8_ = *(undefined8 *)pfVar3;
      tri.colors[0].m_data._8_8_ = *(undefined8 *)(pfVar3 + 2);
      pfVar3 = (float *)((long)(colorBuffer.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar15);
      tri.colors[1].m_data._0_8_ = *(undefined8 *)pfVar3;
      tri.colors[1].m_data._8_8_ = *(undefined8 *)(pfVar3 + 2);
      pfVar3 = (float *)((long)(colorBuffer.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data +
                        (lVar16 >> 0x1c));
      tri.colors[2].m_data._0_8_ = *(undefined8 *)pfVar3;
      tri.colors[2].m_data._8_8_ = *(undefined8 *)(pfVar3 + 2);
      std::
      vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ::push_back((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   *)&local_258,&tri);
      lVar16 = lVar16 + 0x100000000;
      lVar15 = lVar15 + 0x10;
    }
  }
  else if (GVar6 == 6) {
    lVar16 = 0x20;
    for (lVar15 = 1;
        lVar15 < ((long)drawBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)drawBuffer.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) * 0x10000000 + -0x100000000 >>
                 0x20; lVar15 = lVar15 + 1) {
      tcu::TriangleSceneSpec::SceneTriangle::SceneTriangle(&tri);
      tri.positions[0].m_data._0_8_ =
           *(undefined8 *)
            (drawBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start)->m_data;
      tri.positions[0].m_data._8_8_ =
           *(undefined8 *)
            ((drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start)->m_data + 2);
      pfVar3 = (float *)((long)drawBuffer.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_data + lVar16);
      tri.positions[1].m_data._0_8_ = *(undefined8 *)pfVar3;
      tri.positions[1].m_data._8_8_ = *(undefined8 *)(pfVar3 + 2);
      pfVar3 = (float *)((long)(drawBuffer.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar16);
      tri.positions[2].m_data._0_8_ = *(undefined8 *)pfVar3;
      tri.positions[2].m_data._8_8_ = *(undefined8 *)(pfVar3 + 2);
      tri.sharedEdge[0] = false;
      tri.sharedEdge[1] = false;
      tri.sharedEdge[2] = false;
      tri.colors[0].m_data._0_8_ =
           *(undefined8 *)
            (colorBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start)->m_data;
      tri.colors[0].m_data._8_8_ =
           *(undefined8 *)
            ((colorBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start)->m_data + 2);
      pfVar3 = (float *)((long)colorBuffer.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_data + lVar16);
      tri.colors[1].m_data._0_8_ = *(undefined8 *)pfVar3;
      tri.colors[1].m_data._8_8_ = *(undefined8 *)(pfVar3 + 2);
      pfVar3 = (float *)((long)(colorBuffer.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar16);
      tri.colors[2].m_data._0_8_ = *(undefined8 *)pfVar3;
      tri.colors[2].m_data._8_8_ = *(undefined8 *)(pfVar3 + 2);
      std::
      vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ::push_back((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   *)&local_258,&tri);
      lVar16 = lVar16 + 0x10;
    }
  }
  tri.positions[0].m_data._0_8_ =
       ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  poVar4 = (ostringstream *)(tri.positions[0].m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar4);
  std::operator<<((ostream *)poVar4,"Generated vertices:");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&tri,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar4);
  poVar4 = (ostringstream *)(tri.positions[0].m_data + 2);
  lVar15 = 0;
  for (lVar16 = 0;
      lVar16 < (int)((ulong)((long)drawBuffer.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)drawBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4);
      lVar16 = lVar16 + 1) {
    tri.positions[0].m_data._0_8_ =
         ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::operator<<((ostream *)poVar4,"\t");
    tcu::operator<<((ostream *)poVar4,
                    (Vector<float,_4> *)
                    ((long)(drawBuffer.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar15));
    std::operator<<((ostream *)poVar4,",\tcolor= ");
    tcu::operator<<((ostream *)poVar4,
                    (Vector<float,_4> *)
                    ((long)(colorBuffer.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar15));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&tri,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    lVar15 = lVar15 + 0x10;
  }
  BaseRenderingCase::drawPrimitives
            (&this->super_BaseRenderingCase,&resultImage,&drawBuffer,&colorBuffer,this->m_primitive)
  ;
  tri.positions[1].m_data[0] = 0.0;
  tri.positions[1].m_data[1] = 0.0;
  tri.positions[0].m_data[0] = 0.0;
  tri.positions[0].m_data[1] = 0.0;
  tri.positions[0].m_data[2] = 0.0;
  tri.positions[0].m_data[3] = 0.0;
  local_1f0.numSamples = (this->super_BaseRenderingCase).m_numSamples;
  local_1f0.subpixelBits = (this->super_BaseRenderingCase).m_subpixelBits;
  pRVar11 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  local_1f0.redBits = (pRVar11->m_pixelFormat).redBits;
  pRVar11 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  local_1f0.greenBits = (pRVar11->m_pixelFormat).greenBits;
  pRVar11 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  uVar8 = tri.positions[1].m_data._0_8_;
  uVar7 = tri.positions[0].m_data._8_8_;
  uVar5 = tri.positions[0].m_data._0_8_;
  local_1f0.blueBits = (pRVar11->m_pixelFormat).blueBits;
  tri.positions[1].m_data._0_8_ = local_258._M_impl.super__Vector_impl_data._M_end_of_storage;
  tri.positions[0].m_data._0_8_ = local_258._M_impl.super__Vector_impl_data._M_start;
  tri.positions[0].m_data._8_8_ = local_258._M_impl.super__Vector_impl_data._M_finish;
  local_258._M_impl.super__Vector_impl_data._M_start = (pointer)uVar5;
  local_258._M_impl.super__Vector_impl_data._M_finish = (pointer)uVar7;
  local_258._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)uVar8;
  bVar9 = tcu::verifyTriangleGroupInterpolation
                    (&resultImage,(TriangleSceneSpec *)&tri,&local_1f0,
                     ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx)->m_log);
  if (!bVar9) {
    this->m_allIterationsPassed = false;
  }
  std::
  _Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::~_Vector_base((_Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   *)&tri);
  iVar10 = this->m_iteration + 1;
  this->m_iteration = iVar10;
  if (iVar10 == this->m_iterationCount) {
    description = "Found invalid pixel values";
    if (this->m_allIterationsPassed != QP_TEST_RESULT_PASS) {
      description = "Pass";
    }
    IVar12 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,this->m_allIterationsPassed ^ QP_TEST_RESULT_FAIL,description);
  }
  else {
    IVar12 = CONTINUE;
  }
  std::
  _Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::~_Vector_base(&local_258);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&colorBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  tcu::Surface::~Surface(&resultImage);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  std::__cxx11::string::~string((string *)&iterationDescription);
  return IVar12;
}

Assistant:

TriangleInterpolationTest::IterateResult TriangleInterpolationTest::iterate (void)
{
	const std::string								iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection						section					(m_testCtx.getLog(), "Iteration" + de::toString(m_iteration+1), iterationDescription);
	tcu::Surface									resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>							drawBuffer;
	std::vector<tcu::Vec4>							colorBuffer;
	std::vector<TriangleSceneSpec::SceneTriangle>	triangles;

	// generate scene
	generateVertices(m_iteration, drawBuffer, colorBuffer);
	extractTriangles(triangles, drawBuffer, colorBuffer);

	// log
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Generated vertices:" << tcu::TestLog::EndMessage;
		for (int vtxNdx = 0; vtxNdx < (int)drawBuffer.size(); ++vtxNdx)
			m_testCtx.getLog() << tcu::TestLog::Message << "\t" << drawBuffer[vtxNdx] << ",\tcolor= " << colorBuffer[vtxNdx] << tcu::TestLog::EndMessage;
	}

	// draw image
	drawPrimitives(resultImage, drawBuffer, colorBuffer, m_primitive);

	// compare
	{
		RasterizationArguments	args;
		TriangleSceneSpec		scene;

		args.numSamples		= m_numSamples;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= m_context.getRenderTarget().getPixelFormat().redBits;
		args.greenBits		= m_context.getRenderTarget().getPixelFormat().greenBits;
		args.blueBits		= m_context.getRenderTarget().getPixelFormat().blueBits;

		scene.triangles.swap(triangles);

		if (!verifyTriangleGroupInterpolation(resultImage, scene, args, m_testCtx.getLog()))
			m_allIterationsPassed = false;
	}

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Found invalid pixel values");

		return STOP;
	}
	else
		return CONTINUE;
}